

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_rangeproof_sign
              (secp256k1_context *ctx,uchar *proof,size_t *plen,uint64_t min_value,
              secp256k1_pedersen_commitment *commit,uchar *blind,uchar *nonce,int exp,int min_bits,
              uint64_t value,uchar *message,size_t msg_len,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  uchar *puVar1;
  char cVar2;
  byte bVar8;
  byte bVar12;
  char cVar14;
  short sVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  short sVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  uint64_t uVar25;
  uint64_t uVar26;
  short sVar27;
  short sVar28;
  uchar uVar29;
  int iVar30;
  uint64_t uVar31;
  long lVar32;
  secp256k1_fe *rzr;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  secp256k1_scalar *psVar42;
  size_t sVar43;
  secp256k1_gej *r;
  size_t sVar44;
  bool bVar45;
  short sVar46;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar47 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar49;
  undefined1 auVar48 [16];
  ulong uVar50;
  ushort uVar51;
  undefined4 uVar55;
  ulong uVar52;
  undefined1 auVar53 [14];
  ulong uVar56;
  ulong uVar57;
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [14];
  size_t local_6cf8;
  int overflow;
  uchar tmpc [33];
  uchar tmp [33];
  secp256k1_fe local_6c48;
  secp256k1_ge genp;
  secp256k1_sha256 local_6bc8;
  secp256k1_gej local_6b60;
  secp256k1_ge commitp;
  secp256k1_scalar stmp;
  size_t rsizes [32];
  secp256k1_fe r_2;
  size_t secidx [32];
  secp256k1_scalar sec [32];
  secp256k1_scalar k [32];
  uchar local_6038 [8];
  char acStack_6030 [4088];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  byte bVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  byte bVar9;
  char cVar10;
  char cVar11;
  byte bVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  
  if (proof == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_9();
    return 0;
  }
  if (plen == (size_t *)0x0) {
    secp256k1_rangeproof_sign_cold_8();
    return 0;
  }
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_rangeproof_sign_cold_7();
    return 0;
  }
  if (blind == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_6();
    return 0;
  }
  if (nonce == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_5();
    return 0;
  }
  if (msg_len != 0 && message == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_4();
    return 0;
  }
  if (extra_commit_len != 0 && extra_commit == (uchar *)0x0) {
    secp256k1_rangeproof_sign_cold_3();
    return 0;
  }
  if (gen == (secp256k1_generator *)0x0) {
    secp256k1_rangeproof_sign_cold_2();
    return 0;
  }
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_rangeproof_sign_cold_1();
    return 0;
  }
  secp256k1_pedersen_commitment_load(&commitp,commit);
  secp256k1_fe_set_b32(&genp.x,gen->data);
  secp256k1_fe_set_b32(&genp.y,gen->data + 0x20);
  genp.infinity = 0;
  if (*plen < 0x41) {
    return 0;
  }
  if (exp - 0x13U < 0xffffffec) {
    return 0;
  }
  if (0x40 < (uint)min_bits) {
    return 0;
  }
  uVar35 = value - min_value;
  if (value < min_value) {
    return 0;
  }
  rsizes[0] = 1;
  secidx[0] = 0;
  if (exp < 0 || min_value == 0xffffffffffffffff) {
    uVar36 = 0;
    lVar32 = 2;
    sVar44 = 1;
    lVar34 = 1;
    iVar41 = 0;
  }
  else {
    if (0x7ffffffffffffffe < min_value) {
      return 0;
    }
    if (min_value != 0 && (long)value < 0) {
      return 0;
    }
    if (min_value == 0) {
      uVar37 = 0x40;
    }
    else {
      lVar34 = 0x3f;
      if (min_value != 0) {
        for (; min_value >> lVar34 == 0; lVar34 = lVar34 + -1) {
        }
      }
      uVar37 = (uint)lVar34 ^ 0x3f;
    }
    if ((uint)min_bits <= uVar37) {
      uVar37 = min_bits;
    }
    iVar41 = 0;
    if (0x3d < uVar37) {
      exp = 0;
    }
    if ((long)value < 0) {
      exp = 0;
    }
    uVar39 = 0;
    if (min_bits != 0) {
      uVar39 = 0xffffffffffffffff >> (-(char)uVar37 & 0x3fU);
    }
    lVar34 = 1;
    uVar36 = uVar35;
    if (uVar39 < 0x199999999999999a && exp != 0) {
      iVar41 = 0;
      do {
        uVar36 = uVar36 / 10;
        iVar41 = iVar41 + 1;
        if (exp <= iVar41) break;
        bVar45 = uVar39 < 0x28f5c28f5c28f5d;
        uVar39 = uVar39 * 10;
      } while (bVar45);
      lVar34 = 1;
      uVar35 = uVar36;
      iVar30 = iVar41;
      do {
        uVar35 = uVar35 * 10;
        lVar34 = lVar34 * 10;
        iVar30 = iVar30 + -1;
      } while (iVar30 != 0);
    }
    lVar32 = 0x3f;
    if (uVar36 != 0) {
      for (; uVar36 >> lVar32 == 0; lVar32 = lVar32 + -1) {
      }
    }
    uVar38 = 1;
    if (uVar36 != 0) {
      uVar38 = ((uint)lVar32 ^ 0xffffffc0) + 0x41;
    }
    if ((int)uVar38 < (int)uVar37) {
      uVar38 = uVar37;
    }
    sVar44 = (size_t)(uVar38 + 1 >> 1);
    lVar33 = 0;
    lVar32 = 0;
    uVar40 = 0;
    uVar39 = sVar44;
    do {
      uVar50 = (ulong)((uint)(uVar40 < sVar44 - 1) | ~uVar38 & 1);
      *(ulong *)((long)rsizes + lVar33 * 4) = uVar50 * 2 + 2;
      lVar32 = lVar32 + uVar50 * 2 + 2;
      *(ulong *)((long)secidx + lVar33 * 4) = (ulong)((uint)(uVar36 >> ((byte)lVar33 & 0x3f)) & 3);
      uVar40 = uVar40 + 1;
      lVar33 = lVar33 + 2;
      uVar39 = uVar39 - 1;
    } while (uVar39 != 0);
    value = value - uVar35;
    if (1 < rsizes[0]) {
      *proof = (value != 0) << 5 | (byte)iVar41 | 0x40;
      proof[1] = (char)uVar38 + 0xff;
      local_6cf8 = 2;
      goto joined_r0x00130815;
    }
  }
  local_6cf8 = 1;
  *proof = (value != 0) << 5;
joined_r0x00130815:
  if (value != 0) {
    uVar55 = (undefined4)(value >> 0x20);
    auVar23._4_8_ = extraout_XMM0_Qb;
    auVar23._0_4_ = uVar55;
    auVar47._0_8_ = auVar23._0_8_ << 0x20;
    auVar47._8_4_ = (int)value;
    auVar47._12_4_ = uVar55;
    auVar58._0_8_ = value >> 8;
    auVar58._8_8_ = value;
    uVar52 = auVar47._8_8_;
    auVar58 = auVar58 & _DAT_00156210;
    uVar40 = (ulong)DAT_00156210;
    uVar35 = value >> 0x18 & uVar40;
    uVar50 = DAT_00156210._8_8_;
    uVar39 = uVar52 >> 0x10 & uVar50;
    sVar18 = (short)uVar35;
    cVar2 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar35 - (0xff < sVar18);
    sVar18 = (short)(uVar35 >> 0x10);
    sVar46 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)(uVar35 >> 0x10) - (0xff < sVar18),
                      cVar2);
    uVar19 = (ushort)(uVar35 >> 0x20);
    bVar3 = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar35 >> 0x20) - (0xff < uVar19);
    sVar18 = (short)uVar39;
    cVar7 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar39 - (0xff < sVar18);
    sVar18 = (short)(uVar39 >> 0x10);
    sVar27 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)(uVar39 >> 0x10) - (0xff < sVar18),
                      cVar7);
    sVar18 = (short)(uVar39 >> 0x20);
    bVar5 = (0 < sVar18) * (sVar18 < 0x100) * (char)(uVar39 >> 0x20) - (0xff < sVar18);
    sVar18 = auVar58._0_2_;
    cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar58[0] - (0xff < sVar18);
    sVar18 = auVar58._2_2_;
    sVar28 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar58[2] - (0xff < sVar18),cVar6);
    sVar18 = auVar58._4_2_;
    cVar4 = (0 < sVar18) * (sVar18 < 0x100) * auVar58[4] - (0xff < sVar18);
    sVar22 = auVar58._6_2_;
    uVar35 = value >> 0x28 & uVar40;
    uVar39 = uVar52 >> 0x20 & uVar50;
    uVar40 = value >> 0x38 & uVar40;
    uVar50 = uVar52 >> 0x30 & uVar50;
    uVar19 = (ushort)uVar40;
    bVar8 = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar40 - (0xff < uVar19);
    sVar18 = (short)uVar50;
    bVar9 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar50 - (0xff < sVar18);
    sVar18 = (short)uVar35;
    cVar10 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar35 - (0xff < sVar18);
    uVar19 = (ushort)(uVar35 >> 0x10);
    uVar19 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar35 >> 0x10) - (0xff < uVar19),
                      cVar10);
    auVar60._0_12_ = ZEXT212(uVar19) << 0x40;
    sVar18 = (short)uVar39;
    cVar11 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar39 - (0xff < sVar18);
    auVar60[0xc] = cVar11;
    sVar18 = (short)(uVar39 >> 0x10);
    auVar60[0xd] = (0 < sVar18) * (sVar18 < 0x100) * (char)(uVar39 >> 0x10) - (0xff < sVar18);
    bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    bVar12 = (0 < (short)uVar19) * ((short)uVar19 < 0x100) * cVar10 - (0xff < (short)uVar19);
    sVar18 = auVar60._12_2_;
    bVar13 = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
    cVar2 = (0 < sVar46) * (sVar46 < 0x100) * cVar2 - (0xff < sVar46);
    sVar46 = CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),cVar2);
    cVar7 = (0 < sVar27) * (sVar27 < 0x100) * cVar7 - (0xff < sVar27);
    uVar55 = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),CONCAT12(cVar7,sVar46)
                     );
    cVar6 = (0 < sVar28) * (sVar28 < 0x100) * cVar6 - (0xff < sVar28);
    sVar22 = (short)(CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar58[6] - (0xff < sVar22),
                              CONCAT12(cVar4,sVar28)) >> 0x10);
    sVar18 = (short)((uint)uVar55 >> 0x10);
    sVar22 = (short)(CONCAT15((0 < sVar22) * (sVar22 < 0x100) * cVar4 - (0xff < sVar22),
                              CONCAT14(cVar6,uVar55)) >> 0x20);
    *(ulong *)(proof + local_6cf8) =
         (ulong)CONCAT16((0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22),
                         CONCAT15((0 < sVar18) * (sVar18 < 0x100) * cVar7 - (0xff < sVar18),
                                  CONCAT14((0 < sVar46) * (sVar46 < 0x100) * cVar2 - (0xff < sVar46)
                                           ,CONCAT13((bVar13 != 0) * (bVar13 < 0x100) * bVar13 -
                                                     (0xff < bVar13),
                                                     CONCAT12((bVar12 != 0) * (bVar12 < 0x100) *
                                                              bVar12 - (0xff < bVar12),
                                                              CONCAT11((bVar9 != 0) *
                                                                       (bVar9 < 0x100) * bVar9 -
                                                                       (0xff < bVar9),
                                                                       (bVar8 != 0) *
                                                                       (bVar8 < 0x100) * bVar8 -
                                                                       (0xff < bVar8)))))));
    local_6cf8 = local_6cf8 | 8;
  }
  if ((msg_len == 0) || (msg_len <= sVar44 * 0x80 - 0x80)) {
    uVar35 = (ulong)((uint)sVar44 + 6 >> 3);
    if ((lVar32 + sVar44) * 0x20 + uVar35 <= *plen - local_6cf8) {
      local_6bc8.s[0] = 0x6a09e667;
      local_6bc8.s[1] = 0xbb67ae85;
      local_6bc8.s[2] = 0x3c6ef372;
      local_6bc8.s[3] = 0xa54ff53a;
      local_6bc8.s[4] = 0x510e527f;
      local_6bc8.s[5] = 0x9b05688c;
      local_6bc8.s[6] = 0x1f83d9ab;
      local_6bc8.s[7] = 0x5be0cd19;
      local_6bc8.bytes = 0;
      s[1].d[0] = commitp.x.n[4];
      s[0].d[2] = commitp.x.n[2];
      s[0].d[3] = commitp.x.n[3];
      s[0].d[0] = commitp.x.n[0];
      s[0].d[1] = commitp.x.n[1];
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar30 = secp256k1_fe_sqrt(&pubs[0].x,&commitp.y);
      tmp[0] = (byte)iVar30 ^ 1;
      secp256k1_fe_get_b32(tmp + 1,(secp256k1_fe *)s);
      secp256k1_sha256_write(&local_6bc8,tmp,0x21);
      s[1].d[0] = genp.x.n[4];
      s[0].d[2] = genp.x.n[2];
      s[0].d[3] = genp.x.n[3];
      s[0].d[0] = genp.x.n[0];
      s[0].d[1] = genp.x.n[1];
      secp256k1_fe_normalize((secp256k1_fe *)s);
      iVar30 = secp256k1_fe_sqrt(&pubs[0].x,&genp.y);
      tmp[0] = (byte)iVar30 ^ 1;
      secp256k1_fe_get_b32(tmp + 1,(secp256k1_fe *)s);
      secp256k1_sha256_write(&local_6bc8,tmp,0x21);
      secp256k1_sha256_write(&local_6bc8,proof,local_6cf8);
      memset(local_6038,0,0x1000);
      uVar49 = extraout_XMM0_Qb_00;
      if (message != (uchar *)0x0) {
        memcpy(local_6038,message,msg_len);
        uVar49 = extraout_XMM0_Qb_01;
      }
      uVar39 = sVar44 - 1;
      if (1 < stmp.d[sVar44 + 3]) {
        uVar55 = (undefined4)(uVar36 >> 0x20);
        auVar24._4_8_ = uVar49;
        auVar24._0_4_ = uVar55;
        auVar48._0_8_ = auVar24._0_8_ << 0x20;
        auVar48._8_4_ = (int)uVar36;
        auVar48._12_4_ = uVar55;
        auVar59._0_8_ = uVar36 >> 8;
        auVar59._8_8_ = uVar36;
        uVar56 = auVar48._8_8_;
        uVar31 = stmp.d[sVar44 + 3] - 1;
        lVar32 = (uVar31 - (r_2.n[sVar44 + 4] == uVar31)) * 0x20 + uVar39 * 0x80;
        auVar59 = auVar59 & _DAT_00156210;
        uVar52 = (ulong)DAT_00156210;
        uVar40 = uVar36 >> 0x18 & uVar52;
        uVar57 = DAT_00156210._8_8_;
        uVar50 = uVar56 >> 0x10 & uVar57;
        sVar18 = (short)uVar40;
        cVar2 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar40 - (0xff < sVar18);
        sVar18 = (short)(uVar40 >> 0x10);
        sVar46 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)(uVar40 >> 0x10) - (0xff < sVar18)
                          ,cVar2);
        uVar19 = (ushort)(uVar40 >> 0x20);
        bVar3 = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar40 >> 0x20) - (0xff < uVar19);
        sVar18 = (short)uVar50;
        cVar4 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar50 - (0xff < sVar18);
        sVar18 = (short)(uVar50 >> 0x10);
        sVar27 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < sVar18)
                          ,cVar4);
        sVar18 = (short)(uVar50 >> 0x20);
        bVar5 = (0 < sVar18) * (sVar18 < 0x100) * (char)(uVar50 >> 0x20) - (0xff < sVar18);
        sVar18 = auVar59._0_2_;
        cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar59[0] - (0xff < sVar18);
        sVar18 = auVar59._2_2_;
        sVar28 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar59[2] - (0xff < sVar18),cVar6);
        sVar18 = auVar59._4_2_;
        cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar59[4] - (0xff < sVar18);
        sVar22 = auVar59._6_2_;
        uVar40 = uVar36 >> 0x28 & uVar52;
        uVar50 = uVar56 >> 0x20 & uVar57;
        uVar52 = uVar36 >> 0x38 & uVar52;
        uVar57 = uVar56 >> 0x30 & uVar57;
        uVar19 = (ushort)uVar52;
        bVar8 = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar52 - (0xff < uVar19);
        sVar18 = (short)uVar57;
        bVar9 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar57 - (0xff < sVar18);
        sVar18 = (short)uVar40;
        cVar10 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar40 - (0xff < sVar18);
        uVar19 = (ushort)(uVar40 >> 0x10);
        uVar19 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar40 >> 0x10) -
                          (0xff < uVar19),cVar10);
        auVar53._0_12_ = ZEXT212(uVar19) << 0x40;
        sVar18 = (short)uVar50;
        cVar11 = (0 < sVar18) * (sVar18 < 0x100) * (char)uVar50 - (0xff < sVar18);
        auVar53[0xc] = cVar11;
        sVar18 = (short)(uVar50 >> 0x10);
        auVar53[0xd] = (0 < sVar18) * (sVar18 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < sVar18);
        bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
        uVar51 = (ushort)bVar8;
        bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
        bVar12 = (0 < (short)uVar19) * ((short)uVar19 < 0x100) * cVar10 - (0xff < (short)uVar19);
        sVar18 = auVar53._12_2_;
        bVar13 = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
        cVar2 = (0 < sVar46) * (sVar46 < 0x100) * cVar2 - (0xff < sVar46);
        sVar46 = CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),cVar2);
        cVar4 = (0 < sVar27) * (sVar27 < 0x100) * cVar4 - (0xff < sVar27);
        uVar55 = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                          CONCAT12(cVar4,sVar46));
        cVar6 = (0 < sVar28) * (sVar28 < 0x100) * cVar6 - (0xff < sVar28);
        sVar22 = (short)(CONCAT13((0 < sVar22) * (sVar22 < 0x100) * auVar59[6] - (0xff < sVar22),
                                  CONCAT12(cVar7,sVar28)) >> 0x10);
        cVar10 = (bVar8 != 0) * (uVar51 < 0x100) * bVar8 - (0xff < uVar51);
        uVar19 = (ushort)bVar9;
        cVar11 = (bVar9 != 0) * (uVar19 < 0x100) * bVar9 - (0xff < uVar19);
        uVar20 = (ushort)bVar12;
        cVar14 = (bVar12 != 0) * (uVar20 < 0x100) * bVar12 - (0xff < uVar20);
        uVar21 = (ushort)bVar13;
        cVar15 = (bVar13 != 0) * (uVar21 < 0x100) * bVar13 - (0xff < uVar21);
        cVar16 = (0 < sVar46) * (sVar46 < 0x100) * cVar2 - (0xff < sVar46);
        sVar18 = (short)((uint)uVar55 >> 0x10);
        cVar17 = (0 < sVar18) * (sVar18 < 0x100) * cVar4 - (0xff < sVar18);
        sVar22 = (short)(CONCAT15((0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22),
                                  CONCAT14(cVar6,uVar55)) >> 0x20);
        cVar7 = (0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22);
        acStack_6030[lVar32 + 0x10] = cVar10;
        acStack_6030[lVar32 + 0x11] = cVar11;
        acStack_6030[lVar32 + 0x12] = cVar14;
        acStack_6030[lVar32 + 0x13] = cVar15;
        acStack_6030[lVar32 + 0x14] = cVar16;
        acStack_6030[lVar32 + 0x15] = cVar17;
        acStack_6030[lVar32 + 0x16] = cVar7;
        acStack_6030[lVar32 + 0x17] = '\0';
        acStack_6030[lVar32] = cVar10;
        acStack_6030[lVar32 + 1] = cVar11;
        acStack_6030[lVar32 + 2] = cVar14;
        acStack_6030[lVar32 + 3] = cVar15;
        acStack_6030[lVar32 + 4] = cVar16;
        acStack_6030[lVar32 + 5] = cVar17;
        acStack_6030[lVar32 + 6] = cVar7;
        acStack_6030[lVar32 + 7] = '\0';
        acStack_6030[lVar32 + 8] = (bVar8 != 0) * (uVar51 < 0x100) * bVar8 - (0xff < uVar51);
        acStack_6030[lVar32 + 9] = (bVar9 != 0) * (uVar19 < 0x100) * bVar9 - (0xff < uVar19);
        acStack_6030[lVar32 + 10] = (bVar12 != 0) * (uVar20 < 0x100) * bVar12 - (0xff < uVar20);
        acStack_6030[lVar32 + 0xb] = (bVar13 != 0) * (uVar21 < 0x100) * bVar13 - (0xff < uVar21);
        acStack_6030[lVar32 + 0xc] = (0 < sVar46) * (sVar46 < 0x100) * cVar2 - (0xff < sVar46);
        acStack_6030[lVar32 + 0xd] = (0 < sVar18) * (sVar18 < 0x100) * cVar4 - (0xff < sVar18);
        acStack_6030[lVar32 + 0xe] = (0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22);
        acStack_6030[lVar32 + 0xf] = '\0';
        puVar1 = local_6038 + lVar32;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        local_6038[lVar32] = 0x80;
      }
      iVar30 = secp256k1_rangeproof_genrand
                         (sec,s,local_6038,rsizes,sVar44,nonce,&commitp,proof,local_6cf8,&genp);
      if (iVar30 != 0) {
        lVar32 = 0;
        memset(local_6038,0,0x1000);
        sVar43 = sVar44;
        do {
          lVar33 = *(long *)((long)secidx + lVar32 * 2) + lVar32;
          uVar31 = s[lVar33].d[1];
          uVar25 = s[lVar33].d[2];
          uVar26 = s[lVar33].d[3];
          k[0].d[lVar32] = s[lVar33].d[0];
          k[0].d[lVar32 + 1] = uVar31;
          k[0].d[lVar32 + 2] = uVar25;
          k[0].d[lVar32 + 3] = uVar26;
          s[lVar33].d[0] = 0;
          s[lVar33].d[1] = 0;
          s[lVar33].d[2] = 0;
          s[lVar33].d[3] = 0;
          lVar32 = lVar32 + 4;
          sVar43 = sVar43 - 1;
        } while (sVar43 != 0);
        secp256k1_scalar_set_b32(&stmp,blind,&overflow);
        psVar42 = sec + uVar39;
        iVar30 = secp256k1_scalar_add(psVar42,psVar42,&stmp);
        if (overflow != 0) {
          return 0;
        }
        auVar54._0_4_ = -(uint)((int)psVar42->d[0] == 0 && (int)sec[uVar39].d[2] == 0);
        auVar54._4_4_ =
             -(uint)(*(int *)((long)sec[uVar39].d + 4) == 0 &&
                    *(int *)((long)sec[uVar39].d + 0x14) == 0);
        auVar54._8_4_ = -(uint)((int)sec[uVar39].d[1] == 0 && (int)sec[uVar39].d[3] == 0);
        auVar54._12_4_ =
             -(uint)(*(int *)((long)sec[uVar39].d + 0xc) == 0 &&
                    *(int *)((long)sec[uVar39].d + 0x1c) == 0);
        iVar30 = movmskps(iVar30,auVar54);
        if (iVar30 == 0xf) {
          return 0;
        }
        puVar1 = proof + local_6cf8;
        if (1 < (uint)sVar44) {
          memset(puVar1,0,uVar35);
          local_6cf8 = local_6cf8 + uVar35;
        }
        uVar35 = 0;
        lVar32 = 0;
        do {
          lVar33 = lVar32;
          r = pubs + lVar33;
          sVar43 = secidx[uVar35];
          uVar37 = (int)uVar35 * 2;
          rzr = (secp256k1_fe *)(ulong)uVar37;
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,r,sec + uVar35);
          secp256k1_pedersen_ecmult_small
                    (&local_6b60,sVar43 * lVar34 << ((byte)uVar37 & 0x3f),&genp);
          secp256k1_gej_add_var(r,r,&local_6b60,rzr);
          if (pubs[lVar33].infinity != 0) {
            return 0;
          }
          if (uVar35 < uVar39) {
            secp256k1_ge_set_gej_var((secp256k1_ge *)&local_6b60,r);
            local_6c48.n[4] = local_6b60.x.n[4];
            local_6c48.n[2] = local_6b60.x.n[2];
            local_6c48.n[3] = local_6b60.x.n[3];
            local_6c48.n[0] = local_6b60.x.n[0];
            local_6c48.n[1] = local_6b60.x.n[1];
            secp256k1_fe_normalize(&local_6c48);
            iVar30 = secp256k1_fe_sqrt(&r_2,&local_6b60.y);
            tmpc[0] = (byte)iVar30 ^ 1;
            secp256k1_fe_get_b32(tmpc + 1,&local_6c48);
            uVar29 = tmpc[0];
            secp256k1_sha256_write(&local_6bc8,tmpc,0x21);
            puVar1[uVar35 >> 3] = puVar1[uVar35 >> 3] | uVar29 << ((byte)uVar35 & 7);
            *(undefined1 (*) [16])(proof + local_6cf8 + 0x10) = tmpc._17_16_;
            *(undefined8 *)(proof + local_6cf8) = tmpc._1_8_;
            *(undefined8 *)(proof + local_6cf8 + 8) = tmpc._9_8_;
            local_6cf8 = local_6cf8 + 0x20;
          }
          sVar43 = rsizes[uVar35];
          lVar32 = lVar33 + sVar43;
          uVar35 = uVar35 + 1;
        } while (uVar35 != sVar44);
        secp256k1_rangeproof_pub_expand(pubs,iVar41,rsizes,sVar44,&genp);
        if (extra_commit != (uchar *)0x0) {
          secp256k1_sha256_write(&local_6bc8,extra_commit,extra_commit_len);
        }
        secp256k1_sha256_finalize(&local_6bc8,tmp);
        psVar42 = s;
        iVar41 = secp256k1_borromean_sign
                           (&ctx->ecmult_gen_ctx,proof + local_6cf8,psVar42,pubs,k,sec,rsizes,secidx
                            ,sVar44,tmp,0x20);
        if (iVar41 != 0) {
          sVar44 = local_6cf8 + 0x20;
          if (lVar32 != 0) {
            lVar33 = sVar43 + lVar33;
            do {
              secp256k1_scalar_get_b32(proof + sVar44,psVar42);
              sVar44 = sVar44 + 0x20;
              psVar42 = psVar42 + 1;
              lVar33 = lVar33 + -1;
            } while (lVar33 != 0);
          }
          *plen = sVar44;
          return 1;
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_rangeproof_sign(const secp256k1_context* ctx, unsigned char *proof, size_t *plen, uint64_t min_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *nonce, int exp, int min_bits, uint64_t value,
 const unsigned char *message, size_t msg_len, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen){
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(plen != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(message != NULL || msg_len == 0);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_sign_impl(&ctx->ecmult_gen_ctx,
     proof, plen, min_value, &commitp, blind, nonce, exp, min_bits, value, message, msg_len, extra_commit, extra_commit_len, &genp);
}